

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O1

bool __thiscall
MarkdownHighlighter::isPosInACodeSpan(MarkdownHighlighter *this,int blockNumber,int position)

{
  InlineRange *pIVar1;
  InlineRange *pIVar2;
  long lVar3;
  InlineRange *pIVar4;
  QVector<InlineRange> rangeList;
  int local_54;
  QList<MarkdownHighlighter::InlineRange> local_50;
  QList<MarkdownHighlighter::InlineRange> local_38;
  
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (InlineRange *)0x0;
  local_38.d.size = 0;
  local_54 = blockNumber;
  QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::value
            (&local_50,&this->_ranges,&local_54,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,0xc,8);
    }
  }
  pIVar1 = local_50.d.ptr + local_50.d.size;
  lVar3 = local_50.d.size >> 2;
  pIVar2 = local_50.d.ptr;
  if (0 < lVar3) {
    pIVar2 = local_50.d.ptr + lVar3 * 4;
    lVar3 = lVar3 + 1;
    pIVar4 = local_50.d.ptr + 2;
    do {
      if (((pIVar4[-2].begin < position) && (position < pIVar4[-2].end)) &&
         (pIVar4[-2].type == CodeSpan)) {
        pIVar4 = pIVar4 + -2;
        goto LAB_0012831f;
      }
      if (((pIVar4[-1].begin < position) && (position < pIVar4[-1].end)) &&
         (pIVar4[-1].type == CodeSpan)) {
        pIVar4 = pIVar4 + -1;
        goto LAB_0012831f;
      }
      if (((pIVar4->begin < position) && (position < pIVar4->end)) && (pIVar4->type == CodeSpan))
      goto LAB_0012831f;
      if (((pIVar4[1].begin < position) && (position < pIVar4[1].end)) &&
         (pIVar4[1].type == CodeSpan)) {
        pIVar4 = pIVar4 + 1;
        goto LAB_0012831f;
      }
      lVar3 = lVar3 + -1;
      pIVar4 = pIVar4 + 4;
    } while (1 < lVar3);
  }
  lVar3 = ((long)pIVar1 - (long)pIVar2 >> 2) * -0x5555555555555555;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pIVar4 = pIVar1;
      if ((lVar3 != 3) ||
         (((pIVar2->begin < position && (position < pIVar2->end)) &&
          (pIVar4 = pIVar2, pIVar2->type == CodeSpan)))) goto LAB_0012831f;
      pIVar2 = pIVar2 + 1;
    }
    if (((pIVar2->begin < position) && (position < pIVar2->end)) &&
       (pIVar4 = pIVar2, pIVar2->type == CodeSpan)) goto LAB_0012831f;
    pIVar2 = pIVar2 + 1;
  }
  pIVar4 = pIVar1;
  if (pIVar2->type == CodeSpan) {
    pIVar4 = pIVar2;
  }
  if (pIVar2->end <= position) {
    pIVar4 = pIVar1;
  }
  if (position <= pIVar2->begin) {
    pIVar4 = pIVar1;
  }
LAB_0012831f:
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,0xc,8);
    }
  }
  return pIVar4 != pIVar1;
}

Assistant:

bool MarkdownHighlighter::isPosInACodeSpan(int blockNumber, int position) const
{
    const QVector<InlineRange> rangeList = _ranges.value(blockNumber);
    return std::find_if(rangeList.cbegin(), rangeList.cend(),
                                     [position](const InlineRange& range){
        if (position > range.begin && position < range.end && range.type == RangeType::CodeSpan)
            return true;
        return false;
    }) != rangeList.cend();
}